

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdshemu.c
# Opt level: O2

SHEMU_STATUS ShemuMemStore(SHEMU_CONTEXT *Context,ND_UINT64 Gla,ND_UINT64 Size,ND_UINT8 *Value)

{
  ShemuMemAccess p_Var1;
  ND_BOOL NVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  
  NVar2 = ShemuIsShellcodePtr(Context,Gla,Size);
  if (NVar2 == '\0') {
    NVar2 = ShemuIsStackPtr(Context,Gla,Size);
    if (NVar2 == '\0') {
      uVar4 = Context->ExtMemAccess + 1;
      Context->ExtMemAccess = uVar4;
      if (Context->MemThreshold < uVar4) {
        return 1;
      }
      p_Var1 = Context->AccessMemory;
      goto joined_r0x0016411e;
    }
    lVar5 = 0xdd0;
    lVar3 = 0xdb8;
  }
  else {
    uVar4 = Context->Options;
    if ((uVar4 & 4) != 0) {
      return 0;
    }
    NVar2 = ShemuIsIcachePtr(Context,Gla,1);
    if ((NVar2 != '\0') || (NVar2 = ShemuIsIcachePtr(Context,(Gla - 1) + Size,1), NVar2 != '\0')) {
      (Context->Icache).Address = 0;
      (Context->Icache).Size = 0;
    }
    if ((uVar4 & 0x20) != 0) {
      p_Var1 = Context->AccessShellcode;
joined_r0x0016411e:
      if (p_Var1 == (ShemuMemAccess)0x0) {
        return 1;
      }
      NVar2 = (*p_Var1)(Context,Gla,Size,Value,'\x01');
      if (NVar2 != '\0') {
        return 0;
      }
      return 1;
    }
    lVar5 = 0xdc8;
    lVar3 = 0xdb0;
  }
  shemu_memcpy((void *)((Gla - *(long *)((long)&Context->Arch + lVar5)) +
                       *(long *)((long)&Context->Arch + lVar3)),Value,Size);
  return 0;
}

Assistant:

SHEMU_STATUS
ShemuMemStore(
    SHEMU_CONTEXT *Context,
    ND_UINT64 Gla,
    ND_UINT64 Size,
    ND_UINT8 *Value
    )
{
    if (ShemuIsShellcodePtr(Context, Gla, Size))
    {
        // Bypass self-writes, if needed to. No need to invalidate the icache in this case.
        if (!!(Context->Options & SHEMU_OPT_BYPASS_SELF_WRITES))
        {
            return SHEMU_SUCCESS;
        }

        // Flush the instruction cache, if any stored address in it. We can do this AFTER checking
        // for SHEMU_OPT_BYPASS_SELF_WRITES - with that flag set, the shellcode will never be modified.
        if (ShemuIsIcachePtr(Context, Gla, 1) || ShemuIsIcachePtr(Context, Gla + Size - 1, 1))
        {
            ShemuFlushIcache(Context);
        }

        // Shellcode access.
        if (0 == (Context->Options & SHEMU_OPT_DIRECT_MAPPED_SHELL))
        {
            // Shellocode is local copy, we can directly access it.
            ShemuCopyMem(Context->Shellcode + (Gla - Context->ShellcodeBase), Value, Size);
        }
        else
        {
            // Shellcode is directly mapped, we must go through the memory access API. Note that the integrator
            // is free to do whatever it wants with this call - generally, it is a good idea to just discard 
            // modifications. For safety, currently we force the SHEMU_OPT_BYPASS_SELF_WRITES option whenever
            // the SHEMU_OPT_DIRECT_MAPPED_SHELL option is used, to avoid problems.
            if ((ND_NULL == Context->AccessShellcode) ||
                !Context->AccessShellcode(Context, Gla, (ND_SIZET)Size, Value, ND_TRUE))
            {
                return SHEMU_ABORT_GLA_OUTSIDE;
            }
        }
    }
    else if (ShemuIsStackPtr(Context, Gla, Size))
    {
        ShemuCopyMem(Context->Stack + (Gla - Context->StackBase), Value, Size);
    }
    else
    {
        ND_BOOL res = ND_FALSE;

        // We allow a maximum number of external memory accesses, due to performance reasons.
        if (++Context->ExtMemAccess > Context->MemThreshold)
        {
            return SHEMU_ABORT_GLA_OUTSIDE;
        }

        // Handling external stores made by the shellcode can be done in a variety of ways by the integrator. Some
        // of the solutions are:
        // - Abort on external stores; this will cause the emulation to immediately stop;
        // - Discard external stores; this is very simple, and it assumes that modified memory addresses will
        //   not be read later on by the shellcode;
        // - Create a store-buffer like structure, where every external store is cached; when a load is issued on
        //   a previously written address, the value from the store-buffer can be returned;
        // For obvious reasons, actually storing the value at the indicated address is a very, very bad idea.
        if (ND_NULL != Context->AccessMemory)
        {
            res = Context->AccessMemory(Context, Gla, (ND_SIZET)Size, Value, ND_TRUE);
        }

        if (res)
        {
            return SHEMU_SUCCESS;
        }

        return SHEMU_ABORT_GLA_OUTSIDE;
    }

    return SHEMU_SUCCESS;
}